

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keysym2Ucs.c
# Opt level: O1

long XKeysymToUcs(KeySym keysym)

{
  if (((uint)keysym & 0xff000000) == 0x1000000) {
    return (ulong)((uint)keysym & 0xffffff);
  }
  if (keysym - 1 < 0xff) {
    return keysym;
  }
  if (keysym - 0x1a1 < 0x5f) {
    return (ulong)*(ushort *)("" + keysym * 2 + 0x8e);
  }
  if (keysym - 0x2a1 < 0x5e) {
    return (ulong)*(ushort *)("" + keysym * 2 + 0x4e);
  }
  if (keysym - 0x3a2 < 0x5d) {
    return (ulong)*(ushort *)(koi8_r_page00 + keysym * 2 + 0xc);
  }
  if (keysym - 0x4a1 < 0x3f) {
    return (ulong)jisx0212_2charset[keysym + 0x171f];
  }
  if (keysym - 0x58a < 0x75) {
    return (ulong)jisx0212_2charset[keysym + 0x1670];
  }
  if ((keysym & 0xffffffffffffff80) == 0x680) {
    return (ulong)jisx0212_2charset[keysym + 0x15f0];
  }
  if (keysym - 0x7a1 < 0x59) {
    return (ulong)jisx0212_2charset[keysym + 0x154f];
  }
  if (keysym - 0x8a4 < 0x5b) {
    return (ulong)jisx0212_2charset[keysym + 0x14ac];
  }
  if (keysym - 0x9df < 0x1a) {
    return (ulong)jisx0212_2charset[keysym + 0x13d1];
  }
  if (keysym - 0xaa1 < 0x5e) {
    return (ulong)jisx0212_2charset[keysym + 0x132f];
  }
  if (keysym - 0xcdf < 0x1c) {
    return (ulong)jisx0212_2charset[keysym + 0x1151];
  }
  if (keysym - 0xda1 < 0x59) {
    return (ulong)jisx0212_2charset[keysym + 0x10af];
  }
  if (keysym - 0xea0 < 0x60) {
    return (ulong)jisx0212_2charset[keysym + 0x1010];
  }
  if (keysym - 0x12a1 < 0x5e) {
    return (ulong)jisx0212_2charset[keysym + 0xc6f];
  }
  if (keysym - 0x13bc < 3) {
    return (ulong)jisx0212_2charset[keysym + 0xbb2];
  }
  if (keysym - 0x14a1 < 0x5f) {
    return (ulong)jisx0212_2charset[keysym + 0xad7];
  }
  if (keysym - 0x15d0 < 0x27) {
    return (ulong)jisx0212_2charset[keysym + 0xa08];
  }
  if (keysym - 0x16a0 < 0x57) {
    return (ulong)jisx0212_2charset[keysym + 0x960];
  }
  if (keysym - 0x1e9f < 0x61) {
    return (ulong)jisx0212_2charset[keysym + 0x1b9];
  }
  if (keysym - 0x20a0 < 0xd) {
    return (ulong)jisx0212_2charset[keysym + 0x20];
  }
  return 0;
}

Assistant:

long XKeysymToUcs(KeySym keysym) {
  return (long) KeySymToUcs4(keysym);
}